

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

int sam_parse1(kstring_t *s,bam_hdr_t *h,bam1_t *b)

{
  undefined1 *puVar1;
  double dVar2;
  size_t *psVar3;
  bam1_t *pbVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int8_t *piVar8;
  ulong uVar9;
  ushort **ppuVar10;
  size_t sVar11;
  uint uVar12;
  kstring_t *pkVar13;
  ulong uVar14;
  ulong uVar15;
  size_t __n;
  char cVar16;
  byte bVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint32_t *cigar;
  short sVar21;
  kstring_t *pkVar22;
  int iVar23;
  long lVar24;
  kstring_t *pkVar25;
  kstring_t *pkVar26;
  char *pcVar27;
  kstring_t *local_88;
  bam1_t *local_80;
  float x;
  kstring_t *local_70;
  double x_5;
  kstring_t *local_60;
  kstring_t str;
  char *local_38;
  
  pkVar25 = (kstring_t *)s->s;
  b->l_data = 0;
  str.l = 0;
  str.s = (char *)b->data;
  str.m = (size_t)b->m_data;
  (b->core).l_qseq = 0;
  (b->core).mtid = 0;
  (b->core).mpos = 0;
  (b->core).isize = 0;
  (b->core).tid = 0;
  (b->core).pos = 0;
  *(undefined8 *)&(b->core).field_0x8 = 0;
  if (h->cigar_tab == (int8_t *)0x0) {
    piVar8 = (int8_t *)malloc(0x80);
    h->cigar_tab = piVar8;
    for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 1) {
      h->cigar_tab[lVar7] = -1;
    }
    for (lVar7 = 0; lVar7 != 10; lVar7 = lVar7 + 1) {
      h->cigar_tab["MIDNSHP=XB"[lVar7]] = (int8_t)lVar7;
    }
  }
  iVar6 = 0x1000000;
  iVar19 = 1;
  iVar18 = -2;
  pkVar13 = pkVar25;
  while( true ) {
    pkVar26 = (kstring_t *)((long)&pkVar13->l + 1);
    cVar16 = (char)pkVar13->l;
    if (cVar16 == '\0') break;
    if (cVar16 == '\t') {
      *(char *)&pkVar13->l = '\0';
      local_88 = pkVar25;
      local_70 = s;
      local_60 = pkVar26;
      kputsn_(pkVar25,iVar19,&str);
      (b->core).field_0xb = (char)((uint)iVar6 >> 0x18);
      lVar7 = strtol((char *)pkVar26,(char **)&local_60,0);
      *(short *)&(b->core).field_0xc = (short)lVar7;
      if ((char)local_60->l == '\t') {
        local_88 = (kstring_t *)((long)&local_60->l + 1);
        pkVar25 = (kstring_t *)((long)&local_60->l + 2);
        goto LAB_0012e7d2;
      }
      break;
    }
    iVar6 = iVar6 + 0x1000000;
    iVar19 = iVar19 + 1;
    pkVar13 = pkVar26;
  }
  goto LAB_0012f31b;
LAB_0012e7d2:
  cVar16 = *(char *)((long)&pkVar25[-1].s + 7);
  if (cVar16 == '\0') goto LAB_0012f31b;
  if (cVar16 == '\t') {
    *(undefined1 *)((long)&pkVar25[-1].s + 7) = 0;
    local_80 = b;
    if (((char)local_88->l == '*') && (*(char *)((long)&local_60->l + 2) == '\0')) {
      (b->core).tid = -1;
      local_60 = pkVar25;
    }
    else {
      if ((h->n_targets == 0) && (0 < hts_verbose)) {
        local_60 = pkVar25;
        fprintf(_stderr,"[E::%s] missing SAM header\n","sam_parse1");
        goto LAB_0012f31b;
      }
      local_60 = pkVar25;
      iVar19 = bam_name2id(h,(char *)local_88);
      (b->core).tid = iVar19;
      if ((iVar19 < 0) && (1 < hts_verbose)) {
        fprintf(_stderr,"[W::%s] urecognized reference name; treated as unmapped\n","sam_parse1");
      }
    }
    lVar7 = strtol((char *)pkVar25,(char **)&local_60,10);
    iVar19 = (int)lVar7 + -1;
    (b->core).pos = iVar19;
    pkVar25 = (kstring_t *)((long)&local_60->l + 1);
    if ((char)local_60->l == '\t') {
      iVar6 = (b->core).tid;
      local_60 = pkVar25;
      if (iVar19 < 0) {
        if (-1 < iVar6) {
          if (1 < hts_verbose) {
            fprintf(_stderr,
                    "[W::%s] mapped query cannot have zero coordinate; treated as unmapped\n",
                    "sam_parse1");
          }
          (b->core).tid = -1;
        }
LAB_0012e8ed:
        puVar1 = &(b->core).field_0xc;
        *puVar1 = *puVar1 | 4;
      }
      else if (iVar6 < 0) goto LAB_0012e8ed;
      lVar7 = strtol((char *)pkVar25,(char **)&local_60,10);
      pkVar25 = local_60;
      pbVar4 = local_80;
      uVar15 = *(ulong *)&(b->core).field_0x8;
      uVar9 = (ulong)(((uint)lVar7 & 0xff) << 0x10);
      uVar14 = uVar15 & 0xffffffffff00ffff | uVar9;
      *(ulong *)&(b->core).field_0x8 = uVar14;
      if ((char)local_60->l == '\t') {
        pkVar13 = (kstring_t *)((long)&local_60->l + 1);
        cVar16 = (char)pkVar13->l;
        if (cVar16 != '*') {
          pkVar25 = (kstring_t *)((long)&local_60->l + 2);
          uVar14 = 0;
          local_88 = pkVar13;
          while ((pbVar4 = local_80, cVar16 != '\0' && (cVar16 != '\t'))) {
            ppuVar10 = __ctype_b_loc();
            uVar14 = uVar14 + ((*(byte *)((long)*ppuVar10 + (long)cVar16 * 2 + 1) & 8) == 0);
            psVar3 = &pkVar25->l;
            pkVar25 = (kstring_t *)((long)&pkVar25->l + 1);
            cVar16 = (char)*psVar3;
          }
          b = local_80;
          if (cVar16 != '\t') goto LAB_0012f31b;
          local_60 = pkVar25;
          if ((uVar14 < 0x10000) || (hts_verbose < 1)) {
            *(ulong *)&(local_80->core).field_0x8 = uVar15 & 0xffffff00ffff | uVar9 | uVar14 << 0x30
            ;
            ks_resize(&str,(((uint)uVar14 & 0xffff) << 2) + str.l);
            cigar = (uint32_t *)(str.s + str.l);
            uVar15 = *(ulong *)&(pbVar4->core).field_0x8;
            str.l = str.l + (uVar15 >> 0x30) * 4;
            for (uVar14 = 0; uVar14 < uVar15 >> 0x30; uVar14 = uVar14 + 1) {
              lVar7 = strtol((char *)pkVar13,(char **)&local_88,10);
              uVar5 = (int)lVar7 << 4;
              cigar[uVar14] = uVar5;
              lVar7 = (long)(char)local_88->l;
              uVar12 = 0xffffffff;
              if (-1 < lVar7) {
                uVar12 = (uint)h->cigar_tab[lVar7];
              }
              if (((int)uVar12 < 0) && (0 < hts_verbose)) {
                local_38 = "[E::%s] unrecognized CIGAR operator\n";
                goto LAB_0012eda7;
              }
              cigar[uVar14] = uVar12 | uVar5;
              pkVar13 = (kstring_t *)((long)&local_88->l + 1);
              uVar15 = *(ulong *)&(local_80->core).field_0x8;
              local_88 = pkVar13;
            }
            iVar19 = bam_cigar2rlen((uint)(ushort)(uVar15 >> 0x30),cigar);
            b = local_80;
            goto LAB_0012eb03;
          }
          local_38 = "[E::%s] too many CIGAR operations\n";
          goto LAB_0012eda7;
        }
        if (((uVar15 >> 0x22 & 1) == 0) && (1 < hts_verbose)) {
          fprintf(_stderr,"[W::%s] mapped query must have a CIGAR; treated as unmapped\n",
                  "sam_parse1");
          uVar14 = *(ulong *)&(pbVar4->core).field_0x8;
        }
        *(ulong *)&(pbVar4->core).field_0x8 = uVar14 | 0x400000000;
        pkVar25 = (kstring_t *)((long)&pkVar25->l + 2);
        goto LAB_0012ead1;
      }
    }
    goto LAB_0012f31b;
  }
  pkVar25 = (kstring_t *)((long)&pkVar25->l + 1);
  goto LAB_0012e7d2;
code_r0x0012eae4:
  pkVar25 = (kstring_t *)((long)&pkVar25->l + 1);
  goto LAB_0012ead1;
LAB_0012f0d1:
  x_5 = (double)CONCAT44((int)((ulong)x_5 >> 0x20),iVar19);
  local_88 = pkVar22;
  kputc_(0x42,&str);
  kputc_(uVar5,&str);
  kputsn_(&x_5,4,&str);
  if (bVar17 == 0x43) {
    while (pkVar13 = local_70, pkVar22 < pkVar26) {
      uVar15 = strtoul((char *)((long)&pkVar22->l + 1),(char **)&local_88,0);
      kputc_((uint)uVar15 & 0xff,&str);
      pkVar22 = local_88;
    }
    goto LAB_0012ee88;
  }
  if (uVar5 == 0x49) {
    while (pkVar13 = local_70, pkVar22 < pkVar26) {
      uVar15 = strtoul((char *)((long)&pkVar22->l + 1),(char **)&local_88,0);
      x = (float)uVar15;
      kputsn_(&x,4,&str);
      pkVar22 = local_88;
    }
    goto LAB_0012ee88;
  }
  if (uVar5 == 0x53) {
    while (pkVar13 = local_70, pkVar22 < pkVar26) {
      uVar15 = strtoul((char *)((long)&pkVar22->l + 1),(char **)&local_88,0);
      x = (float)CONCAT22(x._2_2_,(short)uVar15);
      kputsn_(&x,2,&str);
      pkVar22 = local_88;
    }
    goto LAB_0012ee88;
  }
  if (uVar5 == 99) {
    while (pkVar13 = local_70, pkVar22 < pkVar26) {
      lVar7 = strtol((char *)((long)&pkVar22->l + 1),(char **)&local_88,0);
      kputc_((int)(char)lVar7,&str);
      pkVar22 = local_88;
    }
    goto LAB_0012ee88;
  }
  if (uVar5 == 0x73) {
    while (pkVar13 = local_70, pkVar22 < pkVar26) {
      lVar7 = strtol((char *)((long)&pkVar22->l + 1),(char **)&local_88,0);
      x = (float)CONCAT22(x._2_2_,(short)lVar7);
      kputsn_(&x,2,&str);
      pkVar22 = local_88;
    }
    goto LAB_0012ee88;
  }
  if (uVar5 == 0x69) {
    while (pkVar13 = local_70, pkVar22 < pkVar26) {
      lVar7 = strtol((char *)((long)&pkVar22->l + 1),(char **)&local_88,0);
      x = (float)lVar7;
      kputsn_(&x,4,&str);
      pkVar22 = local_88;
    }
    goto LAB_0012ee88;
  }
  if (uVar5 == 0x66) {
    while (pkVar13 = local_70, pkVar22 < pkVar26) {
      dVar2 = strtod((char *)((long)&pkVar22->l + 1),(char **)&local_88);
      x = (float)dVar2;
      kputsn_(&x,4,&str);
      pkVar22 = local_88;
    }
    goto LAB_0012ee88;
  }
  pkVar13 = local_70;
  if (0 < hts_verbose) goto code_r0x0012f2ed;
  goto LAB_0012ee88;
code_r0x0012f2ed:
  local_38 = "[E::%s] unrecognized type\n";
  goto LAB_0012eda7;
LAB_0012ead1:
  cVar16 = *(char *)((long)&pkVar25[-1].s + 7);
  b = pbVar4;
  if (cVar16 == '\0') goto LAB_0012f31b;
  if (cVar16 != '\t') goto code_r0x0012eae4;
  *(undefined1 *)((long)&pkVar25[-1].s + 7) = 0;
  iVar19 = 1;
LAB_0012eb03:
  lVar7 = (long)(b->core).pos;
  iVar23 = 0x1249;
  bVar17 = 0xe;
  sVar21 = 0;
  iVar6 = -1;
  for (iVar20 = 0xc; iVar20 != -3; iVar20 = iVar20 + -3) {
    lVar24 = lVar7 >> (bVar17 & 0x3f);
    if (lVar24 == lVar7 + iVar19 + -1 >> (bVar17 & 0x3f)) {
      sVar21 = (short)iVar23 + (short)lVar24;
      break;
    }
    bVar17 = bVar17 + 3;
    iVar23 = iVar23 + (-1 << ((byte)iVar20 & 0x1f));
  }
  *(short *)&(b->core).field_0x8 = sVar21;
  pkVar13 = pkVar25;
  do {
    pkVar26 = pkVar13;
    pkVar13 = (kstring_t *)((long)&pkVar26->l + 1);
    cVar16 = (char)pkVar26->l;
    if (cVar16 == '\0') goto LAB_0012f31b;
  } while (cVar16 != '\t');
  *(undefined1 *)&pkVar26->l = 0;
  cVar16 = (char)pkVar25->l;
  local_88 = pkVar25;
  local_60 = pkVar13;
  if (cVar16 == '*') {
    if (*(char *)((long)&pkVar25->l + 1) != '\0') goto LAB_0012ebcc;
  }
  else if ((cVar16 == '=') && (*(char *)((long)&pkVar25->l + 1) == '\0')) {
    iVar6 = (b->core).tid;
  }
  else {
LAB_0012ebcc:
    iVar6 = bam_name2id(h,(char *)pkVar25);
  }
  (b->core).mtid = iVar6;
  lVar7 = strtol((char *)pkVar13,(char **)&local_60,10);
  iVar19 = (int)lVar7 + -1;
  (b->core).mpos = iVar19;
  pkVar25 = (kstring_t *)((long)&local_60->l + 1);
  if ((char)local_60->l != '\t') goto LAB_0012f31b;
  local_60 = pkVar25;
  if ((iVar19 < 0) && (-1 < (b->core).mtid)) {
    if (1 < hts_verbose) {
      fprintf(_stderr,"[W::%s] mapped mate cannot have zero coordinate; treated as unmapped\n",
              "sam_parse1");
    }
    (b->core).mtid = -1;
  }
  lVar7 = strtol((char *)pkVar25,(char **)&local_60,10);
  pkVar25 = local_60;
  (b->core).isize = (int32_t)lVar7;
  if ((char)local_60->l != '\t') goto LAB_0012f31b;
  lVar7 = 0;
  while( true ) {
    cVar16 = *(char *)((long)&local_60->l + lVar7 + 1);
    if (cVar16 == '\0') goto LAB_0012f31b;
    if (cVar16 == '\t') break;
    lVar7 = lVar7 + 1;
  }
  pkVar13 = (kstring_t *)((long)&local_60->l + lVar7 + 2);
  *(char *)((long)&local_60->l + lVar7 + 1) = '\0';
  if ((*(char *)((long)&local_60->l + 1) == '*') && (*(char *)((long)&local_60->l + 2) == '\0')) {
    (local_80->core).l_qseq = 0;
LAB_0012edbc:
    pbVar4 = local_80;
    local_60 = (kstring_t *)((long)&pkVar25->l + lVar7 + 3);
    sVar11 = 0;
    while ((cVar16 = *(char *)((long)&local_60[-1].s + 7), cVar16 != '\0' && (cVar16 != '\t'))) {
      local_60 = (kstring_t *)((long)&local_60->l + 1);
      sVar11 = sVar11 + 1;
    }
    *(undefined1 *)((long)&local_60[-1].s + 7) = 0;
    local_88 = pkVar13;
    ks_resize(&str,(long)(local_80->core).l_qseq + str.l);
    pcVar27 = str.s + str.l;
    iVar19 = (pbVar4->core).l_qseq;
    __n = (size_t)iVar19;
    str.l = str.l + __n;
    if (((char)pkVar13->l == '*') && (*(char *)((long)&pkVar25->l + lVar7 + 3) == '\0')) {
      memset(pcVar27,0xff,__n);
    }
    else {
      if ((__n != sVar11) && (0 < hts_verbose)) {
        local_38 = "[E::%s] SEQ and QUAL are of different length\n";
        goto LAB_0012eda7;
      }
      for (lVar7 = 0; lVar7 < iVar19; lVar7 = lVar7 + 1) {
        pcVar27[lVar7] = (char)pkVar13->l + -0x21;
        iVar19 = (local_80->core).l_qseq;
        pkVar13 = (kstring_t *)((long)&pkVar13->l + 1);
      }
    }
    pkVar25 = local_70;
    local_38 = "[E::%s] incomplete B-typed aux field\n";
    pkVar13 = local_60;
LAB_0012ee88:
    do {
      while( true ) {
        if ((kstring_t *)(pkVar25->s + pkVar25->l) <= pkVar13) {
          iVar18 = 0;
          b = local_80;
          goto LAB_0012f31b;
        }
        lVar7 = 4;
        for (pkVar26 = pkVar13; (cVar16 = (char)pkVar26->l, cVar16 != '\0' && (cVar16 != '\t'));
            pkVar26 = (kstring_t *)((long)&pkVar26->l + 1)) {
          lVar7 = lVar7 + -1;
        }
        *(char *)&pkVar26->l = '\0';
        local_88 = pkVar13;
        if ((-7 < lVar7 + -5) && (0 < hts_verbose)) {
          local_38 = "[E::%s] incomplete aux field\n";
          goto LAB_0012eda7;
        }
        local_70 = (kstring_t *)((long)&pkVar26->l + 1);
        kputsn_(pkVar13,2,&str);
        bVar17 = *(byte *)((long)&pkVar13->l + 3);
        pkVar22 = (kstring_t *)((long)&pkVar13->l + 5);
        local_88 = pkVar22;
        if ((0x22 < bVar17 - 0x41) || ((0x500000005U >> ((ulong)(bVar17 - 0x41) & 0x3f) & 1) == 0))
        break;
        kputc_(0x41,&str);
        iVar19 = (int)(char)pkVar22->l;
LAB_0012ef33:
        kputc_(iVar19,&str);
        pkVar13 = local_70;
      }
      if ((bVar17 & 0xdf) == 0x49) {
        if ((char)pkVar22->l == '-') {
          uVar15 = strtol((char *)pkVar22,(char **)&local_88,10);
          if (-0x81 < (long)uVar15) {
            iVar19 = 99;
LAB_0012efce:
            kputc_(iVar19,&str);
            iVar19 = (int)uVar15;
            goto LAB_0012ef33;
          }
          if (0xffffffffffff7fff < uVar15) {
            x_5 = (double)CONCAT62(x_5._2_6_,(short)uVar15);
            iVar19 = 0x73;
LAB_0012f02e:
            kputc_(iVar19,&str);
            iVar19 = 2;
            goto LAB_0012f2a0;
          }
          x_5 = (double)CONCAT44(x_5._4_4_,(int)uVar15);
          iVar19 = 0x69;
        }
        else {
          uVar15 = strtoul((char *)pkVar22,(char **)&local_88,10);
          if (uVar15 < 0x100) {
            iVar19 = 0x43;
            goto LAB_0012efce;
          }
          if (uVar15 < 0x10000) {
            x_5 = (double)CONCAT62(x_5._2_6_,(short)uVar15);
            iVar19 = 0x53;
            goto LAB_0012f02e;
          }
          x_5 = (double)CONCAT44(x_5._4_4_,(int)uVar15);
          iVar19 = 0x49;
        }
LAB_0012f28b:
        kputc_(iVar19,&str);
        iVar19 = 4;
LAB_0012f2a0:
        pkVar22 = (kstring_t *)&x_5;
      }
      else {
        if (bVar17 == 0x42) {
          if ((lVar7 < -3) || (hts_verbose < 1)) {
            pkVar22 = (kstring_t *)((long)&pkVar13->l + 6);
            bVar17 = *(byte *)((long)&pkVar13->l + 5);
            uVar5 = (uint)bVar17;
            iVar19 = 0;
            pkVar13 = pkVar22;
            do {
              cVar16 = (char)pkVar13->l;
              if (cVar16 == ',') {
                iVar19 = iVar19 + 1;
              }
              else if (cVar16 == '\0') goto LAB_0012f0d1;
              pkVar13 = (kstring_t *)((long)&pkVar13->l + 1);
            } while( true );
          }
          goto LAB_0012eda7;
        }
        if ((bVar17 != 0x48) && (bVar17 != 0x5a)) {
          if (bVar17 == 100) {
            x_5 = strtod((char *)pkVar22,(char **)&local_88);
            kputc_(100,&str);
            iVar19 = 8;
            goto LAB_0012f2a0;
          }
          if (bVar17 == 0x66) {
            dVar2 = strtod((char *)pkVar22,(char **)&local_88);
            x_5 = (double)CONCAT44(x_5._4_4_,(float)dVar2);
            iVar19 = 0x66;
            goto LAB_0012f28b;
          }
          pkVar13 = local_70;
          if (0 < hts_verbose) {
            local_38 = "[E::%s] unrecognized type\n";
            goto LAB_0012eda7;
          }
          goto LAB_0012ee88;
        }
        kputc_((uint)bVar17,&str);
        iVar19 = -(int)lVar7;
      }
      kputsn_(pkVar22,iVar19,&str);
      pkVar13 = local_70;
    } while( true );
  }
  iVar6 = (int)lVar7;
  (local_80->core).l_qseq = iVar6;
  uVar15 = *(ulong *)&(local_80->core).field_0x8;
  local_60 = pkVar13;
  iVar19 = bam_cigar2qlen((uint)(ushort)(uVar15 >> 0x30),
                          (uint32_t *)(str.s + (uVar15 >> 0x18 & 0xff)));
  if ((uVar15 < 0x1000000000000) || ((iVar19 == iVar6 || (hts_verbose < 1)))) {
    sVar11 = (size_t)(iVar6 + 1 >> 1);
    ks_resize(&str,str.l + sVar11);
    pcVar27 = str.s + str.l;
    str.l = str.l + sVar11;
    bVar17 = 0;
    memset(pcVar27,0,sVar11);
    for (uVar15 = 0; (long)uVar15 < (long)(local_80->core).l_qseq; uVar15 = uVar15 + 1) {
      pcVar27[uVar15 >> 1 & 0x7fffffff] =
           pcVar27[uVar15 >> 1 & 0x7fffffff] |
           "\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x01\x02\x04\b\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f"
           [*(char *)((long)&pkVar25->l + uVar15 + 1)] << (~bVar17 & 4);
      bVar17 = bVar17 + 4;
    }
    goto LAB_0012edbc;
  }
  local_38 = "[E::%s] CIGAR and query sequence are of different length\n";
LAB_0012eda7:
  fprintf(_stderr,local_38,"sam_parse1");
  b = local_80;
LAB_0012f31b:
  b->data = (uint8_t *)str.s;
  b->l_data = (undefined4)str.l;
  b->m_data = (undefined4)str.m;
  return iVar18;
}

Assistant:

int sam_parse1(kstring_t *s, bam_hdr_t *h, bam1_t *b)
{
#define _read_token(_p) (_p); for (; *(_p) && *(_p) != '\t'; ++(_p)); if (*(_p) != '\t') goto err_ret; *(_p)++ = 0
#define _read_token_aux(_p) (_p); for (; *(_p) && *(_p) != '\t'; ++(_p)); *(_p)++ = 0 // this is different in that it does not test *(_p)=='\t'
#define _get_mem(type_t, _x, _s, _l) ks_resize((_s), (_s)->l + (_l)); *(_x) = (type_t*)((_s)->s + (_s)->l); (_s)->l += (_l)
#define _parse_err(cond, msg) do { if ((cond) && hts_verbose >= 1) { fprintf(stderr, "[E::%s] " msg "\n", __func__); goto err_ret; } } while (0)
#define _parse_warn(cond, msg) if ((cond) && hts_verbose >= 2) fprintf(stderr, "[W::%s] " msg "\n", __func__)

    uint8_t *t;
    char *p = s->s, *q;
    int i;
    kstring_t str;
    bam1_core_t *c = &b->core;

    str.l = b->l_data = 0;
    str.s = (char*)b->data; str.m = b->m_data;
    memset(c, 0, 32);
    if (h->cigar_tab == 0) {
        h->cigar_tab = (int8_t*) malloc(128);
        for (i = 0; i < 128; ++i)
            h->cigar_tab[i] = -1;
        for (i = 0; BAM_CIGAR_STR[i]; ++i)
            h->cigar_tab[(int)BAM_CIGAR_STR[i]] = i;
    }
    // qname
    q = _read_token(p);
    kputsn_(q, p - q, &str);
    c->l_qname = p - q;
    // flag
    c->flag = strtol(p, &p, 0);
    if (*p++ != '\t') goto err_ret; // malformated flag
    // chr
    q = _read_token(p);
    if (strcmp(q, "*")) {
        _parse_err(h->n_targets == 0, "missing SAM header");
        c->tid = bam_name2id(h, q);
        _parse_warn(c->tid < 0, "urecognized reference name; treated as unmapped");
    } else c->tid = -1;
    // pos
    c->pos = strtol(p, &p, 10) - 1;
    if (*p++ != '\t') goto err_ret;
    if (c->pos < 0 && c->tid >= 0) {
        _parse_warn(1, "mapped query cannot have zero coordinate; treated as unmapped");
        c->tid = -1;
    }
    if (c->tid < 0) c->flag |= BAM_FUNMAP;
    // mapq
    c->qual = strtol(p, &p, 10);
    if (*p++ != '\t') goto err_ret;
    // cigar
    if (*p != '*') {
        uint32_t *cigar;
        size_t n_cigar = 0;
        for (q = p; *p && *p != '\t'; ++p)
            if (!isdigit(*p)) ++n_cigar;
        if (*p++ != '\t') goto err_ret;
        _parse_err(n_cigar >= 65536, "too many CIGAR operations");
        c->n_cigar = n_cigar;
        _get_mem(uint32_t, &cigar, &str, c->n_cigar<<2);
        for (i = 0; i < c->n_cigar; ++i, ++q) {
            int op;
            cigar[i] = strtol(q, &q, 10)<<BAM_CIGAR_SHIFT;
            op = (uint8_t)*q >= 128? -1 : h->cigar_tab[(int)*q];
            _parse_err(op < 0, "unrecognized CIGAR operator");
            cigar[i] |= op;
        }
        i = bam_cigar2rlen(c->n_cigar, cigar);
    } else {
        _parse_warn(!(c->flag&BAM_FUNMAP), "mapped query must have a CIGAR; treated as unmapped");
        c->flag |= BAM_FUNMAP;
        q = _read_token(p);
        i = 1;
    }
    c->bin = hts_reg2bin(c->pos, c->pos + i, 14, 5);
    // mate chr
    q = _read_token(p);
    if (strcmp(q, "=") == 0) c->mtid = c->tid;
    else if (strcmp(q, "*") == 0) c->mtid = -1;
    else c->mtid = bam_name2id(h, q);
    // mpos
    c->mpos = strtol(p, &p, 10) - 1;
    if (*p++ != '\t') goto err_ret;
    if (c->mpos < 0 && c->mtid >= 0) {
        _parse_warn(1, "mapped mate cannot have zero coordinate; treated as unmapped");
        c->mtid = -1;
    }
    // tlen
    c->isize = strtol(p, &p, 10);
    if (*p++ != '\t') goto err_ret;
    // seq
    q = _read_token(p);
    if (strcmp(q, "*")) {
        c->l_qseq = p - q - 1;
        i = bam_cigar2qlen(c->n_cigar, (uint32_t*)(str.s + c->l_qname));
        _parse_err(c->n_cigar && i != c->l_qseq, "CIGAR and query sequence are of different length");
        i = (c->l_qseq + 1) >> 1;
        _get_mem(uint8_t, &t, &str, i);
        memset(t, 0, i);
        for (i = 0; i < c->l_qseq; ++i)
            t[i>>1] |= seq_nt16_table[(int)q[i]] << ((~i&1)<<2);
    } else c->l_qseq = 0;
    // qual
    q = _read_token_aux(p);
    _get_mem(uint8_t, &t, &str, c->l_qseq);
    if (strcmp(q, "*")) {
        _parse_err(p - q - 1 != c->l_qseq, "SEQ and QUAL are of different length");
        for (i = 0; i < c->l_qseq; ++i) t[i] = q[i] - 33;
    } else memset(t, 0xff, c->l_qseq);
    // aux
    // Note that (like the bam1_core_t fields) this aux data in b->data is
    // stored in host endianness; so there is no byte swapping needed here.
    while (p < s->s + s->l) {
        uint8_t type;
        q = _read_token_aux(p); // FIXME: can be accelerated for long 'B' arrays
        _parse_err(p - q - 1 < 6, "incomplete aux field");
        kputsn_(q, 2, &str);
        q += 3; type = *q++; ++q; // q points to value
        if (type == 'A' || type == 'a' || type == 'c' || type == 'C') {
            kputc_('A', &str);
            kputc_(*q, &str);
        } else if (type == 'i' || type == 'I') {
            if (*q == '-') {
                long x = strtol(q, &q, 10);
                if (x >= INT8_MIN) {
                    kputc_('c', &str); kputc_(x, &str);
                } else if (x >= INT16_MIN) {
                    int16_t y = x;
                    kputc_('s', &str); kputsn_((char*)&y, 2, &str);
                } else {
                    int32_t y = x;
                    kputc_('i', &str); kputsn_(&y, 4, &str);
                }
            } else {
                unsigned long x = strtoul(q, &q, 10);
                if (x <= UINT8_MAX) {
                    kputc_('C', &str); kputc_(x, &str);
                } else if (x <= UINT16_MAX) {
                    uint16_t y = x;
                    kputc_('S', &str); kputsn_(&y, 2, &str);
                } else {
                    uint32_t y = x;
                    kputc_('I', &str); kputsn_(&y, 4, &str);
                }
            }
        } else if (type == 'f') {
            float x;
            x = strtod(q, &q);
            kputc_('f', &str); kputsn_(&x, 4, &str);
        } else if (type == 'd') {
            double x;
            x = strtod(q, &q);
            kputc_('d', &str); kputsn_(&x, 8, &str);
        } else if (type == 'Z' || type == 'H') {
            kputc_(type, &str);kputsn_(q, p - q, &str); // note that this include the trailing NULL
        } else if (type == 'B') {
            int32_t n;
            char *r;
            _parse_err(p - q - 1 < 3, "incomplete B-typed aux field");
            type = *q++; // q points to the first ',' following the typing byte
            for (r = q, n = 0; *r; ++r)
                if (*r == ',') ++n;
            kputc_('B', &str); kputc_(type, &str); kputsn_(&n, 4, &str);
            // FIXME: to evaluate which is faster: a) aligned array and then memmove(); b) unaligned array; c) kputsn_()
            if (type == 'c')      while (q + 1 < p) { int8_t   x = strtol(q + 1, &q, 0); kputc_(x, &str); }
            else if (type == 'C') while (q + 1 < p) { uint8_t  x = strtoul(q + 1, &q, 0); kputc_(x, &str); }
            else if (type == 's') while (q + 1 < p) { int16_t  x = strtol(q + 1, &q, 0); kputsn_(&x, 2, &str); }
            else if (type == 'S') while (q + 1 < p) { uint16_t x = strtoul(q + 1, &q, 0); kputsn_(&x, 2, &str); }
            else if (type == 'i') while (q + 1 < p) { int32_t  x = strtol(q + 1, &q, 0); kputsn_(&x, 4, &str); }
            else if (type == 'I') while (q + 1 < p) { uint32_t x = strtoul(q + 1, &q, 0); kputsn_(&x, 4, &str); }
            else if (type == 'f') while (q + 1 < p) { float    x = strtod(q + 1, &q);    kputsn_(&x, 4, &str); }
            else _parse_err(1, "unrecognized type");
        } else _parse_err(1, "unrecognized type");
    }
    b->data = (uint8_t*)str.s; b->l_data = str.l; b->m_data = str.m;
    return 0;

#undef _parse_warn
#undef _parse_err
#undef _get_mem
#undef _read_token_aux
#undef _read_token
err_ret:
    b->data = (uint8_t*)str.s; b->l_data = str.l; b->m_data = str.m;
    return -2;
}